

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExceptions_cpp.h
# Opt level: O3

void __thiscall moira::Moira::execInterrupt<(moira::Core)2>(Moira *this,u8 level)

{
  u16 sr;
  u16 uVar1;
  uint uVar2;
  
  if (level < 8) {
    (*this->_vptr_Moira[0x10])(this,(ulong)level);
    sr = getSR(this);
    uVar2 = this->flags & 0xfffffff9;
    this->flags = uVar2;
    (this->reg).ipl = '\0';
    (this->reg).sr.ipl = level;
    if ((this->reg).sr.s == false) {
      setSupervisorFlags(this,true,(this->reg).sr.m);
      uVar2 = this->flags;
    }
    (this->reg).sr.t1 = false;
    (this->reg).sr.t0 = false;
    this->flags = uVar2 & 0xffffffcf;
    uVar1 = getIrqVector(this,level);
    (this->queue).ird = uVar1;
    writeStackFrame0000<(moira::Core)2>(this,sr,(this->reg).pc,uVar1 << 2);
    if ((this->reg).sr.m == true) {
      writeStackFrame0001<(moira::Core)2>(this,sr,(this->reg).pc,(this->queue).ird << 2);
    }
    jumpToVector<(moira::Core)2,1024ull>(this,(uint)(this->queue).ird);
    return;
  }
  __assert_fail("level < 8",
                "/workspace/llm4binary/github/license_c_cmakelists/dirkwhoffmann[P]Moira/Moira/MoiraExceptions_cpp.h"
                ,0x1f9,"void moira::Moira::execInterrupt(u8) [C = moira::Core::C68020]");
}

Assistant:

void
Moira::execInterrupt(u8 level)
{
    assert(level < 8);

    // Notify delegate
    willInterrupt(level);

    // Remember the current value of the status register
    u16 status = getSR();

    // Recover from stop state and terminate loop mode
    flags &= ~(State::STOPPED | State::LOOPING);

    // Clear the polled IPL value
    reg.ipl = 0;

    // Temporarily raise the interrupt threshold
    reg.sr.ipl = level;

    // Enter supervisor mode
    setSupervisorMode(true);

    // Disable tracing
    clearTraceFlags();
    flags &= ~State::TRACE_EXC;

    switch (C) {

        case Core::C68000:

            SYNC(6);
            reg.sp -= 6;
            write<C, AddrSpace::DATA, Word>(reg.sp + 4, reg.pc & 0xFFFF);

            SYNC(4);
            queue.ird = getIrqVector(level);

            SYNC(4);
            write<C, AddrSpace::DATA, Word>(reg.sp + 0, status);
            write<C, AddrSpace::DATA, Word>(reg.sp + 2, reg.pc >> 16);
            break;

        case Core::C68010:

            SYNC(12);
            reg.sp -= 8;
            queue.ird = getIrqVector(level);
            write<C, AddrSpace::DATA, Word>(reg.sp + 4, reg.pc & 0xFFFF);
            write<C, AddrSpace::DATA, Word>(reg.sp + 0, status);
            write<C, AddrSpace::DATA, Word>(reg.sp + 2, reg.pc >> 16);
            write<C, AddrSpace::DATA, Word>(reg.sp + 6, 4 * queue.ird);
            break;

        case Core::C68020:

            queue.ird = getIrqVector(level);

            writeStackFrame0000<C>(status, reg.pc, 4 * queue.ird);

            if (reg.sr.m) {

                writeStackFrame0001<C>(status, reg.pc, 4 * queue.ird);
            }
    }

    jumpToVector<C, AE_SET_CB3>(queue.ird);
}